

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

size_t xm_get_memory_needed_for_context(char *moddata,size_t moddata_length)

{
  uint uVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ushort uVar6;
  ulong uVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  ushort uVar11;
  uint uVar12;
  ushort uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  
  if (moddata_length < 0x45) {
    uVar2 = 0;
  }
  else {
    uVar2 = (ushort)(byte)moddata[0x44];
  }
  if (moddata_length < 0x46) {
    uVar1 = 0;
  }
  else {
    uVar1 = (uint)(byte)moddata[0x45] << 8;
  }
  if (moddata_length < 0x47) {
    uVar11 = 0;
  }
  else {
    uVar11 = (ushort)(byte)moddata[0x46];
  }
  if (moddata_length < 0x48) {
    uVar12 = 0;
  }
  else {
    uVar12 = (uint)(byte)moddata[0x47] << 8;
  }
  if (moddata_length < 0x49) {
    uVar9 = 0;
  }
  else {
    uVar9 = (ushort)(byte)moddata[0x48];
  }
  if (moddata_length < 0x4a) {
    uVar13 = 0;
  }
  else {
    uVar13 = (ushort)(byte)moddata[0x49] << 8;
  }
  if (moddata_length < 0x41) {
    uVar3 = 0;
  }
  else {
    uVar3 = (uint)(byte)moddata[0x40];
  }
  if (moddata_length < 0x42) {
    uVar16 = 0;
  }
  else {
    uVar16 = (uint)(byte)moddata[0x41] << 8;
  }
  if (moddata_length < 0x3d) {
    uVar7 = 0;
  }
  else {
    uVar7 = (ulong)(byte)moddata[0x3c];
  }
  if (moddata_length < 0x3e) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)(byte)moddata[0x3d] << 8;
  }
  if (moddata_length < 0x3f) {
    uVar8 = 0;
  }
  else {
    uVar8 = (uint)(byte)moddata[0x3e];
  }
  if (moddata_length < 0x40) {
    uVar10 = 0;
  }
  else {
    uVar10 = (uint)(byte)moddata[0x3f] << 8;
  }
  lVar4 = (ulong)(uVar13 | uVar9) * 0xf8 + (ulong)((uVar12 | uVar11) << 4) +
          (ulong)((uVar16 | uVar3) << 8);
  uVar7 = (uVar5 | uVar7) + (ulong)((uVar10 | uVar8) << 0x10) + 0x3c;
  if ((short)uVar12 != 0 || uVar11 != 0) {
    uVar12 = uVar11 + uVar12;
    do {
      if (uVar7 + 5 < moddata_length) {
        uVar5 = (ulong)(byte)moddata[uVar7 + 5];
      }
      else {
        uVar5 = 0;
      }
      if (uVar7 + 6 < moddata_length) {
        uVar17 = (ulong)(byte)moddata[uVar7 + 6] << 8;
      }
      else {
        uVar17 = 0;
      }
      if (uVar7 < moddata_length) {
        uVar3 = (uint)(byte)moddata[uVar7];
      }
      else {
        uVar3 = 0;
      }
      if (uVar7 + 1 < moddata_length) {
        uVar16 = (uint)(byte)moddata[uVar7 + 1] << 8;
      }
      else {
        uVar16 = 0;
      }
      if (uVar7 + 2 < moddata_length) {
        uVar8 = (uint)(byte)moddata[uVar7 + 2];
      }
      else {
        uVar8 = 0;
      }
      if (uVar7 + 3 < moddata_length) {
        uVar10 = (uint)(byte)moddata[uVar7 + 3] << 8;
      }
      else {
        uVar10 = 0;
      }
      if (uVar7 + 7 < moddata_length) {
        uVar15 = (uint)(byte)moddata[uVar7 + 7];
      }
      else {
        uVar15 = 0;
      }
      if (uVar7 + 8 < moddata_length) {
        iVar14 = (uint)(byte)moddata[uVar7 + 8] << 8;
      }
      else {
        iVar14 = 0;
      }
      lVar4 = lVar4 + (uVar17 | uVar5) * (ulong)(uVar1 | uVar2) * 5;
      uVar7 = (iVar14 + uVar15 + ((uVar10 | uVar8) << 0x10 | uVar16 | uVar3)) + uVar7;
      uVar11 = (short)uVar12 - 1;
      uVar12 = (uint)uVar11;
    } while (uVar11 != 0);
  }
  if ((uVar13 | uVar9) != 0) {
    uVar11 = 0;
    do {
      if (uVar7 + 0x1b < moddata_length) {
        uVar12 = (uint)(byte)moddata[uVar7 + 0x1b];
      }
      else {
        uVar12 = 0;
      }
      uVar16 = 0;
      uVar3 = 0;
      if (uVar7 + 0x1c < moddata_length) {
        uVar3 = (uint)(byte)moddata[uVar7 + 0x1c] << 8;
      }
      if (uVar7 < moddata_length) {
        uVar16 = (uint)(byte)moddata[uVar7];
      }
      uVar8 = 0;
      uVar10 = 0;
      if (uVar7 + 1 < moddata_length) {
        uVar10 = (uint)(byte)moddata[uVar7 + 1] << 8;
      }
      if (uVar7 + 2 < moddata_length) {
        uVar8 = (uint)(byte)moddata[uVar7 + 2];
      }
      uVar15 = 0;
      if (uVar7 + 3 < moddata_length) {
        uVar15 = (uint)(byte)moddata[uVar7 + 3] << 8;
      }
      lVar4 = (ulong)(uVar3 | uVar12) * 0x38 + lVar4;
      uVar8 = (uVar15 | uVar8) * 0x10000;
      uVar5 = (ulong)(uVar10 | uVar16 | uVar8);
      if (((uVar10 | uVar16) + uVar8) - 0x108 < 0xfffffef9) {
        uVar5 = 0x107;
      }
      uVar7 = uVar7 + uVar5;
      if ((short)uVar3 == 0 && (short)uVar12 == 0) {
        uVar5 = 0;
      }
      else {
        uVar12 = uVar12 + uVar3;
        uVar3 = 0;
        do {
          uVar5 = uVar7;
          uVar16 = 0;
          if (uVar5 < moddata_length) {
            uVar16 = (uint)(byte)moddata[uVar5];
          }
          uVar8 = 0;
          uVar10 = 0;
          if (uVar5 + 1 < moddata_length) {
            uVar10 = (uint)(byte)moddata[uVar5 + 1] << 8;
          }
          if (uVar5 + 2 < moddata_length) {
            uVar8 = (uint)(byte)moddata[uVar5 + 2];
          }
          uVar15 = 0;
          if (uVar5 + 3 < moddata_length) {
            uVar15 = (uint)(byte)moddata[uVar5 + 3] << 8;
          }
          uVar16 = (uVar15 | uVar8) << 0x10 | uVar10 | uVar16;
          uVar3 = uVar3 + uVar16;
          lVar4 = lVar4 + (ulong)uVar16;
          uVar6 = (short)uVar12 - 1;
          uVar12 = (uint)uVar6;
          uVar7 = uVar5 + 0x28;
        } while (uVar6 != 0);
        uVar7 = uVar5 + 0x28;
        uVar5 = (ulong)uVar3;
      }
      uVar7 = uVar7 + uVar5;
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uVar9 | uVar13));
  }
  return (ulong)(uVar1 | uVar2) * 0x138 + lVar4 + 0x170;
}

Assistant:

size_t xm_get_memory_needed_for_context(const char* moddata, size_t moddata_length) {
	size_t memory_needed = 0;
	size_t offset = 60; /* Skip the first header */
	uint16_t num_channels;
	uint16_t num_patterns;
	uint16_t num_instruments;

	/* Read the module header */

	num_channels = READ_U16(offset + 8);
	num_patterns = READ_U16(offset + 10);
	memory_needed += num_patterns * sizeof(xm_pattern_t);

	num_instruments = READ_U16(offset + 12);
	memory_needed += num_instruments * sizeof(xm_instrument_t);

	memory_needed += MAX_NUM_ROWS * READ_U16(offset + 4) * sizeof(uint8_t); /* Module length */

	/* Header size */
	offset += READ_U32(offset);

	/* Read pattern headers */
	for(uint16_t i = 0; i < num_patterns; ++i) {
		uint16_t num_rows;

		num_rows = READ_U16(offset + 5);
		memory_needed += num_rows * num_channels * sizeof(xm_pattern_slot_t);

		/* Pattern header length + packed pattern data size */
		offset += READ_U32(offset) + READ_U16(offset + 7);
	}

	/* Read instrument headers */
	for(uint16_t i = 0; i < num_instruments; ++i) {
		uint16_t num_samples;
		uint32_t sample_size_aggregate = 0;

		num_samples = READ_U16(offset + 27);
		memory_needed += num_samples * sizeof(xm_sample_t);

		/* Instrument header size */
		uint32_t ins_header_size = READ_U32(offset);
		if (ins_header_size == 0 || ins_header_size > INSTRUMENT_HEADER_LENGTH)
			ins_header_size = INSTRUMENT_HEADER_LENGTH;
		offset += ins_header_size;

		for(uint16_t j = 0; j < num_samples; ++j) {
			uint32_t sample_size;

			sample_size = READ_U32(offset);
			sample_size_aggregate += sample_size;
			memory_needed += sample_size;
			offset += 40; /* See comment in xm_load_module() */
		}

		offset += sample_size_aggregate;
	}

	memory_needed += num_channels * sizeof(xm_channel_context_t);
	memory_needed += sizeof(xm_context_t);

	return memory_needed;
}